

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBABecLap.cpp
# Opt level: O2

void __thiscall
amrex::MLEBABecLap::averageDownCoeffsSameAmrLevel
          (MLEBABecLap *this,int amrlev,Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *a
          ,Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
           *b,Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *b_eb)

{
  FabArray<amrex::FArrayBox> *this_00;
  pointer pMVar1;
  pointer pMVar2;
  pointer pIVar3;
  pointer pMVar4;
  pointer paVar5;
  pointer ppMVar6;
  MultiFab *crse;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  IntVect ratio;
  Array<MultiFab_*,_3> local_60;
  Array<const_MultiFab_*,_3> local_48;
  
  pMVar1 = (a->super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>).
           super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pMVar2 = (a->super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>).
           super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar8 = 0x780;
  lVar10 = 0;
  lVar7 = 0;
  for (lVar9 = 1; lVar9 < (int)(((long)pMVar1 - (long)pMVar2) / 0x180); lVar9 = lVar9 + 1) {
    if (amrlev < 1) {
      pIVar3 = (this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.mg_coarsen_ratio_vec.
               super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
               super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
               super__Vector_impl_data._M_start;
      ratio.vect[2] = *(int *)((long)pIVar3->vect + lVar7 + 8);
      ratio.vect._0_8_ = *(undefined8 *)((long)pIVar3->vect + lVar7);
    }
    else {
      ratio.vect._0_8_ = &DAT_200000002;
      ratio.vect[2] = 2;
    }
    pMVar4 = (a->super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>).
             super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
             super__Vector_impl_data._M_start;
    this_00 = (FabArray<amrex::FArrayBox> *)
              ((long)&pMVar4[1].super_FabArray<amrex::FArrayBox>.super_FabArrayBase + lVar10);
    if ((this->m_a_scalar != 0.0) || (NAN(this->m_a_scalar))) {
      EB_average_down((MultiFab *)
                      ((long)&(pMVar4->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + lVar10
                      ),(MultiFab *)this_00,0,1,&ratio);
    }
    else {
      FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>(this_00,0.0);
    }
    paVar5 = (b->
             super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
             ).
             super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_60._M_elems[2] =
         (MultiFab *)((long)&paVar5->_M_elems[0].super_FabArray<amrex::FArrayBox> + lVar8);
    local_48._M_elems[0] = (MultiFab *)((long)paVar5 + lVar8 + -0x780);
    local_48._M_elems[1] = (MultiFab *)((long)paVar5 + lVar8 + -0x600);
    local_48._M_elems[2] =
         (MultiFab *)((long)&paVar5[-1]._M_elems[0].super_FabArray<amrex::FArrayBox> + lVar8);
    local_60._M_elems[0] = (MultiFab *)((long)paVar5 + lVar8 + -0x300);
    local_60._M_elems[1] = (MultiFab *)((long)paVar5 + lVar8 + -0x180);
    EB_average_down_faces(&local_48,&local_60,&ratio,0);
    ppMVar6 = (b_eb->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
              super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    crse = ppMVar6[lVar9];
    if (crse != (MultiFab *)0x0) {
      EB_average_down_boundaries(ppMVar6[lVar9 + -1],crse,&ratio,0);
    }
    lVar7 = lVar7 + 0xc;
    lVar8 = lVar8 + 0x480;
    lVar10 = lVar10 + 0x180;
  }
  return;
}

Assistant:

void
MLEBABecLap::averageDownCoeffsSameAmrLevel (int amrlev, Vector<MultiFab>& a,
                                            Vector<Array<MultiFab,AMREX_SPACEDIM> >& b,
                                            const Vector<MultiFab*>& b_eb)
{
    int nmglevs = a.size();
    for (int mglev = 1; mglev < nmglevs; ++mglev)
    {
        IntVect ratio = (amrlev > 0) ? IntVect(mg_coarsen_ratio) : mg_coarsen_ratio_vec[mglev-1];

        if (m_a_scalar == 0.0)
        {
            a[mglev].setVal(0.0);
        }
        else
        {
            amrex::EB_average_down(a[mglev-1], a[mglev], 0, 1, ratio);
        }

        amrex::EB_average_down_faces(amrex::GetArrOfConstPtrs(b[mglev-1]),
                                     amrex::GetArrOfPtrs(b[mglev]),
                                     ratio, 0);

        if (b_eb[mglev])
        {
            amrex::EB_average_down_boundaries(*b_eb[mglev-1], *b_eb[mglev],
                                              ratio, 0);
        }
    }
}